

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

int64_t __thiscall xmrig::DaemonClient::submit(DaemonClient *this,JobResult *result)

{
  uint32_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  int64_t iVar4;
  bool bVar5;
  uint64_t uVar6;
  mapped_type *pmVar7;
  long lVar8;
  int __flags;
  Value params;
  String local_a0;
  Document doc;
  
  bVar5 = String::operator!=(&result->jobId,
                             (this->m_blocktemplate).m_data +
                             ((this->m_blocktemplate).m_size - 0x20));
  if (bVar5) {
    lVar8 = -1;
  }
  else {
    Buffer::toHex((uint8_t *)&result->nonce,4,(uint8_t *)((this->m_blocktemplate).m_data + 0x4e));
    __flags = 0;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(&doc,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    params.data_.n = (Number)0x0;
    params.data_.s.str = (Ch *)0x4000000000000;
    String::toJSON(&local_a0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(&params,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_a0,doc.allocator_);
    JsonRequest::create(&doc,BaseClient::m_sequence,"submitblock",&params);
    iVar4 = BaseClient::m_sequence;
    uVar2 = result->diff;
    uVar3 = *(ulong *)(result->m_result + 0x18);
    uVar1 = result->backend;
    uVar6 = Chrono::steadyMSecs();
    pmVar7 = std::
             map<long,_xmrig::SubmitResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::SubmitResult>_>_>
             ::operator[](&(this->super_BaseClient).m_results,&BaseClient::m_sequence);
    pmVar7->reqId = 0;
    pmVar7->seq = iVar4;
    pmVar7->backend = uVar1;
    pmVar7->actualDiff = 0xffffffffffffffff / uVar3;
    pmVar7->diff = uVar2;
    pmVar7->elapsed = 0;
    pmVar7->m_start = uVar6;
    send(this,3,"/json_rpc",(size_t)&doc,__flags);
    lVar8 = BaseClient::m_sequence;
    BaseClient::m_sequence = BaseClient::m_sequence + 1;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&doc);
  }
  return lVar8;
}

Assistant:

int64_t xmrig::DaemonClient::submit(const JobResult &result)
{
    if (result.jobId != (m_blocktemplate.data() + m_blocktemplate.size() - 32)) {
        return -1;
    }

    Buffer::toHex(reinterpret_cast<const uint8_t *>(&result.nonce), 4, m_blocktemplate.data() + 78);

    using namespace rapidjson;
    Document doc(kObjectType);

    Value params(kArrayType);
    params.PushBack(m_blocktemplate.toJSON(), doc.GetAllocator());

    JsonRequest::create(doc, m_sequence, "submitblock", params);

    m_results[m_sequence] = SubmitResult(m_sequence, result.diff, result.actualDiff(), 0, result.backend);

    send(HTTP_POST, kJsonRPC, doc);

    return m_sequence++;
}